

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_2::CheckMemoryAccess
          (ValidationState_t *_,Instruction *inst,uint32_t index)

{
  ushort uVar1;
  StorageClass SVar2;
  StorageClass SVar3;
  uint uVar4;
  uint32_t uVar5;
  spv_result_t sVar6;
  Instruction *pIVar7;
  long lVar8;
  size_t index_00;
  char *pcVar9;
  string local_228;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  SVar2 = Max;
  if (uVar1 < 0x1169) {
    if (1 < uVar1 - 0x3f) {
      if (uVar1 != 0x3d) {
        if (uVar1 != 0x3e) goto switchD_00191211_caseD_14f1;
        goto switchD_00191211_caseD_14f0;
      }
      goto switchD_00191211_caseD_14ef;
    }
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar7 = ValidationState_t::FindDef(_,uVar4);
    pIVar7 = ValidationState_t::FindDef(_,(pIVar7->inst_).type_id);
    SVar3 = Instruction::GetOperandAs<spv::StorageClass>(pIVar7,1);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar7 = ValidationState_t::FindDef(_,uVar4);
    pIVar7 = ValidationState_t::FindDef(_,(pIVar7->inst_).type_id);
    SVar2 = Instruction::GetOperandAs<spv::StorageClass>(pIVar7,1);
  }
  else {
    switch(uVar1) {
    case 0x14f0:
    case 0x14f8:
switchD_00191211_caseD_14f0:
      index_00 = 0;
      break;
    case 0x14f1:
    case 0x14f2:
    case 0x14f3:
    case 0x14f4:
    case 0x14f5:
    case 0x14f6:
switchD_00191211_caseD_14f1:
      SVar3 = Max;
      goto LAB_001912c1;
    default:
      if (uVar1 == 0x116a) goto switchD_00191211_caseD_14f0;
      if (uVar1 != 0x1169) goto switchD_00191211_caseD_14f1;
    case 0x14ef:
    case 0x14f7:
switchD_00191211_caseD_14ef:
      index_00 = 2;
    }
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,index_00);
    pIVar7 = ValidationState_t::FindDef(_,uVar4);
    pIVar7 = ValidationState_t::FindDef(_,(pIVar7->inst_).type_id);
    SVar3 = Instruction::GetOperandAs<spv::StorageClass>(pIVar7,1);
  }
LAB_001912c1:
  if ((ulong)index <
      (ulong)((long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)index);
    if ((uVar4 & 8) == 0) {
LAB_001912f3:
      if ((uVar4 & 0x10) == 0) {
        if ((uVar4 & 0x20) != 0) goto LAB_00191303;
LAB_00191339:
        if ((uVar4 & 2) != 0) {
          return SPV_SUCCESS;
        }
        goto joined_r0x00191366;
      }
      uVar1 = (inst->inst_).opcode;
      if (uVar1 < 0x14f0) {
        if ((uVar1 == 0x3e) || (uVar1 == 0x116a)) {
LAB_0019147f:
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar9 = "MakePointerVisibleKHR cannot be used with OpStore.";
          lVar8 = 0x32;
          goto LAB_001914a3;
        }
      }
      else if ((uVar1 == 0x14f8) || (uVar1 == 0x14f0)) goto LAB_0019147f;
      if ((uVar4 & 0x20) == 0) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"NonPrivatePointerKHR must be specified if ",0x2a);
        pcVar9 = "MakePointerVisibleKHR is specified.";
        lVar8 = 0x23;
      }
      else {
        uVar5 = GetMakeVisibleScope(inst,uVar4,index);
        sVar6 = ValidateMemoryScope(_,inst,uVar5);
        if (sVar6 != SPV_SUCCESS) {
          return sVar6;
        }
LAB_00191303:
        if ((((SVar3 < (StorageBuffer|Input)) && ((0x1934U >> (SVar3 & 0x1f) & 1) != 0)) ||
            (SVar3 == PhysicalStorageBuffer)) &&
           (((SVar2 < (StorageBuffer|Input) && ((0x1934U >> (SVar2 & 0x1f) & 1) != 0)) ||
            ((SVar2 == PhysicalStorageBuffer || (SVar2 == Max)))))) goto LAB_00191339;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"NonPrivatePointerKHR requires a pointer in Uniform, ",0x34
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,
                   "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer ",0x3b);
        pcVar9 = "storage classes.";
        lVar8 = 0x10;
      }
    }
    else {
      uVar1 = (inst->inst_).opcode;
      if (uVar1 < 0x14ef) {
        if ((uVar1 != 0x3d) && (uVar1 != 0x1169)) {
LAB_001914ce:
          if ((uVar4 & 0x20) != 0) {
            uVar5 = GetMakeAvailableScope(inst,uVar4,index);
            sVar6 = ValidateMemoryScope(_,inst,uVar5);
            if (sVar6 != SPV_SUCCESS) {
              return sVar6;
            }
            goto LAB_001912f3;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar9 = "NonPrivatePointerKHR must be specified if MakePointerAvailableKHR is specified."
          ;
          lVar8 = 0x4f;
          goto LAB_001914a3;
        }
      }
      else if ((uVar1 != 0x14f7) && (uVar1 != 0x14ef)) goto LAB_001914ce;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar9 = "MakePointerAvailableKHR cannot be used with OpLoad.";
      lVar8 = 0x33;
    }
LAB_001914a3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar9,lVar8);
  }
  else {
joined_r0x00191366:
    if ((SVar3 != PhysicalStorageBuffer) && (SVar2 != PhysicalStorageBuffer)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_228,_,0x1264,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Memory accesses with PhysicalStorageBuffer must use Aligned.",
               0x3c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t CheckMemoryAccess(ValidationState_t& _, const Instruction* inst,
                               uint32_t index) {
  spv::StorageClass dst_sc, src_sc;
  std::tie(dst_sc, src_sc) = GetStorageClass(_, inst);
  if (inst->operands().size() <= index) {
    // Cases where lack of some operand is invalid
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
    return SPV_SUCCESS;
  }

  const uint32_t mask = inst->GetOperandAs<uint32_t>(index);
  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerAvailableKHR)) {
    if (inst->opcode() == spv::Op::OpLoad ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadTensorNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerAvailableKHR cannot be used with OpLoad.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
                "MakePointerAvailableKHR is specified.";
    }

    // Check the associated scope for MakeAvailableKHR.
    const auto available_scope = GetMakeAvailableScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, available_scope))
      return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerVisibleKHR)) {
    if (inst->opcode() == spv::Op::OpStore ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreKHR ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreTensorNV) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerVisibleKHR cannot be used with OpStore.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
             << "MakePointerVisibleKHR is specified.";
    }

    // Check the associated scope for MakeVisibleKHR.
    const auto visible_scope = GetMakeVisibleScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, visible_scope)) return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR)) {
    if (dst_sc != spv::StorageClass::Uniform &&
        dst_sc != spv::StorageClass::Workgroup &&
        dst_sc != spv::StorageClass::CrossWorkgroup &&
        dst_sc != spv::StorageClass::Generic &&
        dst_sc != spv::StorageClass::Image &&
        dst_sc != spv::StorageClass::StorageBuffer &&
        dst_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
    if (src_sc != spv::StorageClass::Max &&
        src_sc != spv::StorageClass::Uniform &&
        src_sc != spv::StorageClass::Workgroup &&
        src_sc != spv::StorageClass::CrossWorkgroup &&
        src_sc != spv::StorageClass::Generic &&
        src_sc != spv::StorageClass::Image &&
        src_sc != spv::StorageClass::StorageBuffer &&
        src_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
  }

  if (!(mask & uint32_t(spv::MemoryAccessMask::Aligned))) {
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
  }

  return SPV_SUCCESS;
}